

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O2

double interpolate_linear(double *xin,double *yin,int N,double z)

{
  double dVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  double *__ptr;
  double *__ptr_00;
  int *pos;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  double local_38;
  
  lVar4 = (long)N;
  __ptr = (double *)malloc(lVar4 * 8);
  __ptr_00 = (double *)malloc(lVar4 * 8);
  pos = (int *)malloc(lVar4 * 4);
  sort1d_ascending(xin,N,pos);
  uVar5 = 0;
  uVar7 = 0;
  if (0 < N) {
    uVar7 = (ulong)(uint)N;
  }
  for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    iVar8 = pos[uVar5];
    __ptr[uVar5] = xin[iVar8];
    __ptr_00[uVar5] = yin[iVar8];
  }
  if (*__ptr <= z) {
    if (__ptr[lVar4 + -1] <= z && z != __ptr[lVar4 + -1]) {
      local_38 = __ptr_00[lVar4 + -1];
    }
    else {
      iVar8 = N + -1;
      iVar3 = 0;
      while (iVar6 = iVar3, iVar6 < iVar8 + -1) {
        iVar3 = (iVar6 + iVar8) / 2;
        if (z < __ptr[iVar3]) {
          iVar8 = iVar3;
          iVar3 = iVar6;
        }
      }
      dVar1 = __ptr[iVar8];
      if ((dVar1 != z) || (NAN(dVar1) || NAN(z))) {
        dVar2 = __ptr[iVar6];
        local_38 = __ptr_00[iVar6];
        if ((dVar2 != z) || (NAN(dVar2) || NAN(z))) {
          local_38 = local_38 + ((z - dVar2) / (dVar1 - dVar2)) * (__ptr_00[iVar8] - local_38);
        }
      }
      else {
        local_38 = __ptr_00[iVar8];
      }
    }
  }
  else {
    local_38 = *__ptr_00;
  }
  free(__ptr);
  free(__ptr_00);
  free(pos);
  return local_38;
}

Assistant:

double interpolate_linear(double *xin,double *yin, int N, double z) {
	int i,j,k;
	double *x,*y;
	int *pos;
	double out,ylo,yhi;

	x = (double*)malloc(sizeof(double)*N);
	y = (double*)malloc(sizeof(double)*N);
	pos = (int*)malloc(sizeof(int)*N);

	sort1d_ascending(xin,N,pos);

	for(i = 0; i < N;++i) {
		x[i] = xin[pos[i]];
		y[i] = yin[pos[i]];
	}

	ylo= y[0];
	yhi = y[N-1];

	i = 0;
	j = N - 1;

	if (z < x[0]) {
		free(x);
		free(y);
		free(pos);
		return ylo;
	}

	if (z > x[j]) {
		free(x);
		free(y);
		free(pos);
		return yhi;
	}

	while (i < j-1) {
		k = (i + j)/2;
		if (z < x[k]) {
			j = k;
		} else {
			i = k;
		}
	}

	if (z == x[j]) {
		out = y[j];
		free(x);
		free(y);
		free(pos);
		return out;
	}

	if (z == x[i]) {
		out = y[i];
		free(x);
		free(y);
		free(pos);
		return out;
	}

	out = y[i] + (y[j] - y[i])* ((z - x[i])/(x[j] - x[i]));

	free(x);
	free(y);
	free(pos);

	return out;
}